

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<double>::RepeatedField
          (RepeatedField<double> *this,Arena *arena,RepeatedField<double> *rhs)

{
  ulong uVar1;
  int new_size;
  int iVar2;
  double *__src;
  char *__dest;
  
  protobuf::internal::ShortSooRep::ShortSooRep((ShortSooRep *)this,arena);
  if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0) {
    protobuf::internal::LongSooRep::elements((LongSooRep *)this);
  }
  uVar1 = (rhs->soo_rep_).field_0.long_rep.elements_int;
  new_size = protobuf::internal::SooRep::size(&rhs->soo_rep_,(uVar1 & 4) == 0);
  if (new_size != 0) {
    if (1 < new_size) {
      Grow(this,true,0,new_size);
    }
    iVar2 = protobuf::internal::SooRep::size(&this->soo_rep_,new_size < 2);
    if ((iVar2 != new_size) &&
       ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
        (undefined1  [16])0x0)) {
      protobuf::internal::LongSooRep::elements((LongSooRep *)this);
    }
    set_size(this,new_size < 2,new_size);
    __src = elements(rhs,(uVar1 & 4) == 0);
    if (new_size < 2) {
      __dest = (char *)((long)&(this->soo_rep_).field_0 + 8);
    }
    else {
      __dest = protobuf::internal::LongSooRep::elements((LongSooRep *)this);
    }
    memcpy(__dest,__src,(long)new_size << 3);
    return;
  }
  return;
}

Assistant:

inline RepeatedField<Element>::RepeatedField(Arena* arena,
                                             const RepeatedField& rhs)
    : soo_rep_(arena) {
  StaticValidityCheck();
  AnnotateSize(kSooCapacityElements, 0);
  const bool rhs_is_soo = rhs.is_soo();
  if (auto size = rhs.size(rhs_is_soo)) {
    bool is_soo = true;
    if (size > kSooCapacityElements) {
      Grow(is_soo, 0, size);
      is_soo = false;
    }
    ExchangeCurrentSize(is_soo, size);
    UninitializedCopyN(rhs.elements(rhs_is_soo), size, unsafe_elements(is_soo));
  }
}